

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

void get_payload(cio_buffered_stream *buffered_stream,void *handler_context,cio_error err,
                cio_read_buffer *buffer,size_t num_bytes)

{
  _Bool _Var1;
  uint8_t *data;
  cio_websocket *local_50;
  size_t data_in_buffer;
  uint8_t *ptr;
  cio_websocket *websocket;
  size_t num_bytes_local;
  cio_read_buffer *buffer_local;
  cio_error err_local;
  void *handler_context_local;
  cio_buffered_stream *buffered_stream_local;
  
  _Var1 = handled_read_error((cio_websocket *)handler_context,err);
  if (!_Var1) {
    data = cio_read_buffer_get_read_ptr(buffer);
    _Var1 = is_control_frame((uint)(*(ushort *)((long)handler_context + 0x10) >> 1 & 0xf));
    websocket = (cio_websocket *)num_bytes;
    if (((_Var1 ^ 0xffU) & 1) != 0) {
      local_50 = (cio_websocket *)cio_read_buffer_unread_bytes(buffer);
      if (*(cio_websocket **)((long)handler_context + 8) < local_50) {
        local_50 = *(cio_websocket **)((long)handler_context + 8);
      }
      websocket = local_50;
      *(long *)((long)handler_context + 8) = *(long *)((long)handler_context + 8) - (long)local_50;
    }
    cio_read_buffer_consume(buffer,(size_t)websocket);
    handle_frame((cio_websocket *)handler_context,data,(uint64_t)websocket);
  }
  return;
}

Assistant:

static void get_payload(struct cio_buffered_stream *buffered_stream, void *handler_context, enum cio_error err, struct cio_read_buffer *buffer, size_t num_bytes)
{
	(void)buffered_stream;

	struct cio_websocket *websocket = (struct cio_websocket *)handler_context;
	if (cio_unlikely(handled_read_error(websocket, err))) {
		return;
	}

	uint8_t *ptr = cio_read_buffer_get_read_ptr(buffer);
	if (cio_likely(!is_control_frame(websocket->ws_private.ws_flags.opcode))) {
		size_t data_in_buffer = cio_read_buffer_unread_bytes(buffer);
		num_bytes = CIO_MIN(websocket->ws_private.remaining_read_frame_length, data_in_buffer);
		websocket->ws_private.remaining_read_frame_length -= num_bytes;
	}

	cio_read_buffer_consume(buffer, num_bytes);
	handle_frame(websocket, ptr, num_bytes);
}